

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

UInt32 Range_DecodeBit_RAR(void *pp,UInt32 size0)

{
  uint uVar1;
  undefined4 local_24;
  UInt32 value;
  UInt32 bit;
  CPpmd7z_RangeDec *p;
  UInt32 size0_local;
  void *pp_local;
  
  uVar1 = (**pp)(pp,0x4000);
  if (size0 <= uVar1) {
    (**(code **)((long)pp + 8))(pp,size0,0x4000 - size0);
  }
  else {
    (**(code **)((long)pp + 8))(pp,0,size0);
  }
  local_24 = (uint)(size0 <= uVar1);
  return local_24;
}

Assistant:

static UInt32 Range_DecodeBit_RAR(void *pp, UInt32 size0)
{
  CPpmd7z_RangeDec *p = (CPpmd7z_RangeDec *)pp;
  UInt32 bit, value = p->p.GetThreshold(p, PPMD_BIN_SCALE);
  if(value < size0)
  {
    bit = 0;
    p->p.Decode(p, 0, size0);
  }
  else
  {
    bit = 1;
    p->p.Decode(p, size0, PPMD_BIN_SCALE - size0);
  }
  return bit;
}